

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
* embree::SceneGraph::transformMSMBlurBuffer<embree::Vec3fx>
            (vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
             *positions_in,Transformations *spaces)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 *puVar9;
  long in_RDX;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *in_RSI;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *in_RDI;
  size_t i_5;
  avector<embree::Vec3fx> verts_1;
  AffineSpace3ff space;
  float time;
  size_t t;
  size_t j;
  avector<embree::Vec3fx> verts;
  size_t i;
  size_t num_vertices;
  size_t num_time_steps;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *positions_out;
  size_t i_6;
  size_t i_7;
  size_t i_2;
  size_t i_3;
  size_t i_4;
  size_t i_1;
  value_type *in_stack_fffffffffffff4a8;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *in_stack_fffffffffffff4b0;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *pvVar10;
  size_t in_stack_fffffffffffff4b8;
  Vec3fx *in_stack_fffffffffffff4e0;
  Transformations *in_stack_fffffffffffff4e8;
  float local_b08;
  float local_afc;
  float local_af4;
  BBox1f local_a78;
  BBox1f BStack_a70;
  pointer local_a60;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  local_a58;
  Transformations *local_a40;
  undefined1 local_a38 [16];
  undefined1 local_a28 [16];
  undefined1 local_a18 [16];
  undefined1 local_a08 [20];
  float local_9f4;
  ulong local_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  pointer local_9d0;
  undefined1 local_9c8 [8];
  pointer local_9c0;
  pointer local_9b8;
  void *local_9b0;
  ulong local_9a8;
  pointer local_990;
  size_type local_988;
  undefined1 local_979;
  long local_978;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *local_970;
  long local_960;
  const_reference local_958;
  pointer local_950;
  const_reference local_948;
  pointer local_940;
  const_reference local_938;
  pointer local_930;
  const_reference local_928;
  pointer local_920;
  const_reference local_918;
  pointer local_910;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *local_908;
  pointer local_900;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *local_8f8;
  pointer local_8f0;
  undefined1 *local_8e8;
  pointer local_8e0;
  undefined1 *local_8d8;
  BBox1f *local_8d0;
  BBox1f *local_8c8;
  undefined8 *local_8c0;
  undefined8 *local_8b8;
  undefined1 *local_8b0;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *local_8a0;
  pointer local_890;
  undefined1 *local_888;
  pointer local_880;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *local_878;
  long local_870;
  ulong local_868;
  long local_860;
  ulong local_858;
  long local_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  Vec3fx *local_7f0;
  undefined1 *local_7e8;
  BBox1f *local_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 *local_7c0;
  undefined1 *local_7b8;
  undefined8 *local_7b0;
  BBox1f *local_7a8;
  undefined8 *local_7a0;
  undefined8 *local_798;
  BBox1f *local_790;
  float local_788;
  float fStack_784;
  float fStack_780;
  float fStack_77c;
  BBox1f *local_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 *local_730;
  undefined1 *local_728;
  undefined8 *local_720;
  undefined8 *local_718;
  undefined8 *local_710;
  undefined8 *local_708;
  undefined8 *local_700;
  float local_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  undefined8 *local_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined1 *local_6a0;
  undefined1 *local_698;
  undefined8 *local_690;
  undefined8 *local_688;
  undefined1 *local_680;
  undefined8 *local_678;
  undefined8 *local_670;
  float local_668;
  float fStack_664;
  float fStack_660;
  float fStack_65c;
  undefined8 *local_650;
  float local_648;
  float fStack_644;
  float fStack_640;
  float fStack_63c;
  undefined8 local_638;
  undefined8 uStack_630;
  float local_624;
  undefined8 *local_620;
  float local_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float local_608;
  float local_604;
  undefined8 *local_600;
  float local_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float local_5e8;
  float local_5e4;
  undefined8 *local_5e0;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float local_5c8;
  undefined1 *puStack_5c0;
  undefined8 *local_5b8;
  undefined8 *local_5b0;
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  undefined8 *local_590;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined1 *local_560;
  undefined8 *local_558;
  undefined8 *local_550;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  undefined8 *local_530;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined1 *local_500;
  undefined8 *local_4f8;
  undefined8 *local_4f0;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  undefined8 *local_4d0;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  Vec3fx *local_450;
  undefined8 *local_448;
  undefined8 *local_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 *local_420;
  undefined8 *local_418;
  undefined8 *local_410;
  undefined8 *local_408;
  undefined8 *local_400;
  undefined8 *local_3f8;
  undefined8 *local_3f0;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined8 *local_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 *local_390;
  undefined8 *local_388;
  undefined8 *local_380;
  undefined8 *local_378;
  undefined8 *local_370;
  undefined8 *local_368;
  undefined8 *local_360;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined8 *local_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 *local_300;
  undefined8 *local_2f8;
  undefined8 *local_2f0;
  undefined8 *local_2e8;
  undefined8 *local_2e0;
  undefined8 *local_2d8;
  undefined8 *local_2d0;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  undefined8 *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  float local_284;
  undefined8 *local_280;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float local_264;
  undefined8 *local_260;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float local_244;
  undefined8 *local_240;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  undefined8 *puStack_220;
  undefined8 *local_218;
  undefined8 *local_210;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined8 *local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 *local_160;
  undefined8 *local_158;
  undefined8 *local_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined8 *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  pointer local_f0;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *local_e8;
  pointer local_d0;
  undefined1 *local_c8;
  pointer local_c0;
  void *local_b8;
  undefined1 *local_b0;
  pointer local_90;
  Transformations *local_88;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *local_80;
  pointer local_60;
  pointer local_58;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *local_50;
  pointer local_48;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *local_40;
  BBox1f *local_38;
  pointer local_30;
  pointer local_28;
  undefined1 *local_20;
  pointer local_18;
  undefined1 *local_10;
  void *local_8;
  
  local_979 = 0;
  local_978 = in_RDX;
  local_970 = in_RSI;
  std::
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ::vector((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
            *)0x3241bf);
  local_988 = std::
              vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ::size(local_970);
  local_958 = std::
              vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ::operator[](local_970,0);
  local_990 = (pointer)local_958->size_active;
  if (local_988 == 1) {
    local_9a8 = 0;
    while( true ) {
      local_960 = local_978;
      local_870 = local_978 + 8;
      if (*(ulong *)(local_978 + 0x10) <= local_9a8) break;
      local_888 = local_9c8;
      local_890 = local_990;
      local_9c0 = (pointer)0x0;
      local_9b8 = (pointer)0x0;
      local_9b0 = (void *)0x0;
      local_28 = local_990;
      local_20 = local_888;
      if (local_990 != (pointer)0x0) {
        local_18 = local_990;
        local_10 = local_888;
        local_9b0 = alignedMalloc(in_stack_fffffffffffff4b8,(size_t)in_stack_fffffffffffff4b0);
        for (local_30 = (pointer)0x0; local_30 < local_28; local_30 = (pointer)&local_30->field_0x1)
        {
          local_8 = (void *)((long)local_9b0 + (long)local_30 * 0x10);
        }
        local_9b8 = local_28;
      }
      local_9c0 = local_9b8;
      for (local_9d0 = (pointer)0x0; local_9d0 < local_990;
          local_9d0 = (pointer)&local_9d0->field_0x1) {
        local_860 = local_978;
        local_868 = local_9a8;
        local_850 = local_978 + 8;
        local_858 = local_9a8;
        puVar9 = (undefined8 *)(*(long *)(local_978 + 0x20) + local_9a8 * 0x40);
        local_918 = std::
                    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ::operator[](local_970,0);
        local_920 = local_9d0;
        local_450 = local_918->items + (long)local_9d0;
        local_440 = &local_9e8;
        local_284 = (local_450->field_0).m128[0];
        local_280 = &local_468;
        local_118 = CONCAT44(local_284,local_284);
        uStack_110 = CONCAT44(local_284,local_284);
        local_264 = (local_450->field_0).m128[1];
        local_260 = &local_488;
        local_178 = CONCAT44(local_264,local_264);
        uStack_170 = CONCAT44(local_264,local_264);
        local_388 = puVar9 + 2;
        local_244 = (local_450->field_0).m128[2];
        local_240 = &local_4a8;
        local_1d8 = CONCAT44(local_244,local_244);
        uStack_1d0 = CONCAT44(local_244,local_244);
        local_2f8 = puVar9 + 4;
        local_300 = puVar9 + 6;
        local_2e8 = &local_498;
        local_2f0 = &local_4a8;
        local_210 = &local_318;
        uVar1 = *local_2f8;
        uVar2 = puVar9[5];
        local_1e8._0_4_ = (float)uVar1;
        local_1e8._4_4_ = (float)((ulong)uVar1 >> 0x20);
        uStack_1e0._0_4_ = (float)uVar2;
        uStack_1e0._4_4_ = (float)((ulong)uVar2 >> 0x20);
        local_208 = local_244 * (float)local_1e8;
        fStack_204 = local_244 * local_1e8._4_4_;
        fStack_200 = local_244 * (float)uStack_1e0;
        fStack_1fc = local_244 * uStack_1e0._4_4_;
        local_1f0 = &local_318;
        local_298 = CONCAT44(fStack_204,local_208);
        uStack_290 = CONCAT44(fStack_1fc,fStack_200);
        local_2d0 = &local_498;
        local_2d8 = &local_318;
        uVar3 = *local_300;
        uVar4 = puVar9[7];
        local_2a8._0_4_ = (float)uVar3;
        local_2a8._4_4_ = (float)((ulong)uVar3 >> 0x20);
        uStack_2a0._0_4_ = (float)uVar4;
        uStack_2a0._4_4_ = (float)((ulong)uVar4 >> 0x20);
        local_2c8 = local_208 + (float)local_2a8;
        fStack_2c4 = fStack_204 + local_2a8._4_4_;
        fStack_2c0 = fStack_200 + (float)uStack_2a0;
        fStack_2bc = fStack_1fc + uStack_2a0._4_4_;
        local_2b0 = &local_498;
        local_378 = &local_478;
        local_380 = &local_488;
        local_390 = &local_498;
        local_1b0 = &local_3a8;
        uVar5 = *local_388;
        uVar6 = puVar9[3];
        local_188._0_4_ = (float)uVar5;
        local_188._4_4_ = (float)((ulong)uVar5 >> 0x20);
        uStack_180._0_4_ = (float)uVar6;
        uStack_180._4_4_ = (float)((ulong)uVar6 >> 0x20);
        local_1a8 = local_264 * (float)local_188;
        fStack_1a4 = local_264 * local_188._4_4_;
        fStack_1a0 = local_264 * (float)uStack_180;
        fStack_19c = local_264 * uStack_180._4_4_;
        local_190 = &local_3a8;
        local_328 = CONCAT44(fStack_1a4,local_1a8);
        uStack_320 = CONCAT44(fStack_19c,fStack_1a0);
        local_360 = &local_478;
        local_368 = &local_3a8;
        local_338._0_4_ = (float)local_498;
        local_338._4_4_ = (float)((ulong)local_498 >> 0x20);
        uStack_330._0_4_ = (float)uStack_490;
        uStack_330._4_4_ = (float)((ulong)uStack_490 >> 0x20);
        local_358 = local_1a8 + (float)local_338;
        fStack_354 = fStack_1a4 + local_338._4_4_;
        fStack_350 = fStack_1a0 + (float)uStack_330;
        fStack_34c = fStack_19c + uStack_330._4_4_;
        local_340 = &local_478;
        local_408 = &local_9e8;
        local_410 = &local_468;
        local_420 = &local_478;
        local_150 = &local_438;
        uVar7 = *puVar9;
        uVar8 = puVar9[1];
        local_128._0_4_ = (float)uVar7;
        local_128._4_4_ = (float)((ulong)uVar7 >> 0x20);
        uStack_120._0_4_ = (float)uVar8;
        uStack_120._4_4_ = (float)((ulong)uVar8 >> 0x20);
        local_148 = local_284 * (float)local_128;
        fStack_144 = local_284 * local_128._4_4_;
        fStack_140 = local_284 * (float)uStack_120;
        fStack_13c = local_284 * uStack_120._4_4_;
        local_130 = &local_438;
        local_3b8 = CONCAT44(fStack_144,local_148);
        uStack_3b0 = CONCAT44(fStack_13c,fStack_140);
        local_3f0 = &local_9e8;
        local_3f8 = &local_438;
        local_3c8._0_4_ = (float)local_478;
        local_3c8._4_4_ = (float)((ulong)local_478 >> 0x20);
        uStack_3c0._0_4_ = (float)uStack_470;
        uStack_3c0._4_4_ = (float)((ulong)uStack_470 >> 0x20);
        local_3e8 = local_148 + (float)local_3c8;
        fStack_3e4 = fStack_144 + local_3c8._4_4_;
        fStack_3e0 = fStack_140 + (float)uStack_3c0;
        fStack_3dc = fStack_13c + uStack_3c0._4_4_;
        local_3d0 = &local_9e8;
        local_9e8 = CONCAT44(fStack_3e4,local_3e8);
        uStack_9e0 = CONCAT44(fStack_3dc,fStack_3e0);
        local_8d8 = local_9c8;
        local_8e0 = local_9d0;
        local_8b8 = (undefined8 *)((long)local_9b0 + (long)local_9d0 * 0x10);
        local_8c0 = &local_9e8;
        *local_8b8 = local_9e8;
        local_8b8[1] = uStack_9e0;
        local_448 = puVar9;
        local_418 = puVar9;
        local_400 = local_420;
        local_3c8 = local_478;
        uStack_3c0 = uStack_470;
        local_370 = local_390;
        local_338 = local_498;
        uStack_330 = uStack_490;
        local_2e0 = local_300;
        local_2a8 = uVar3;
        uStack_2a0 = uVar4;
        local_278 = local_284;
        fStack_274 = local_284;
        fStack_270 = local_284;
        fStack_26c = local_284;
        local_268 = local_284;
        local_258 = local_264;
        fStack_254 = local_264;
        fStack_250 = local_264;
        fStack_24c = local_264;
        local_248 = local_264;
        local_238 = local_244;
        fStack_234 = local_244;
        fStack_230 = local_244;
        fStack_22c = local_244;
        local_228 = local_244;
        puStack_220 = local_2f8;
        local_218 = local_2f0;
        local_1e8 = uVar1;
        uStack_1e0 = uVar2;
        local_1c0 = local_388;
        local_1b8 = local_380;
        local_188 = uVar5;
        uStack_180 = uVar6;
        local_160 = puVar9;
        local_158 = local_410;
        local_128 = uVar7;
        uStack_120 = uVar8;
        local_4a8 = local_1d8;
        uStack_4a0 = uStack_1d0;
        local_498 = CONCAT44(fStack_2c4,local_2c8);
        uStack_490 = CONCAT44(fStack_2bc,fStack_2c0);
        local_488 = local_178;
        uStack_480 = uStack_170;
        local_478 = CONCAT44(fStack_354,local_358);
        uStack_470 = CONCAT44(fStack_34c,fStack_350);
        local_468 = local_118;
        uStack_460 = uStack_110;
        local_438 = local_3b8;
        uStack_430 = uStack_3b0;
        local_3a8 = local_328;
        uStack_3a0 = uStack_320;
        local_318 = local_298;
        uStack_310 = uStack_290;
        local_928 = std::
                    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ::operator[](local_970,0);
        local_930 = local_9d0;
        local_8f0 = local_9d0;
        local_8e8 = local_9c8;
        *(float *)((long)local_9b0 + (long)local_9d0 * 0x10 + 0xc) =
             local_928->items[(long)local_9d0].field_0.m128[3];
      }
      std::
      vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
      ::push_back(in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8);
      local_8b0 = local_9c8;
      for (local_d0 = (pointer)0x0; local_d0 < local_9c0; local_d0 = (pointer)&local_d0->field_0x1)
      {
      }
      local_c0 = local_9b8;
      local_b8 = local_9b0;
      local_c8 = local_8b0;
      local_b0 = local_8b0;
      alignedFree(in_stack_fffffffffffff4a8);
      local_9a8 = local_9a8 + 1;
    }
  }
  else {
    for (local_9f0 = 0; local_9f0 < local_988; local_9f0 = local_9f0 + 1) {
      if (local_988 < 2) {
        local_b08 = 0.0;
      }
      else {
        local_af4 = (float)local_9f0;
        local_afc = (float)(local_988 - 1);
        local_b08 = local_af4 / local_afc;
      }
      local_9f4 = local_b08;
      Transformations::interpolate
                (in_stack_fffffffffffff4e8,(float)((ulong)in_stack_fffffffffffff4e0 >> 0x20));
      local_878 = &local_a58;
      local_880 = local_990;
      local_a58.
      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a58.
      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a40 = (Transformations *)0x0;
      local_58 = local_990;
      local_50 = local_878;
      if (local_990 != (pointer)0x0) {
        local_48 = local_990;
        local_40 = local_878;
        in_stack_fffffffffffff4e8 =
             (Transformations *)
             alignedMalloc(in_stack_fffffffffffff4b8,(size_t)in_stack_fffffffffffff4b0);
        for (local_60 = (pointer)0x0; local_60 < local_58; local_60 = (pointer)&local_60->field_0x1)
        {
          local_38 = &in_stack_fffffffffffff4e8->time_range + (long)local_60 * 2;
        }
        local_a58.
        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_58;
        local_a40 = in_stack_fffffffffffff4e8;
      }
      local_a58.
      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_a58.
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      for (local_a60 = (pointer)0x0; local_a60 < local_990;
          local_a60 = (pointer)&local_a60->field_0x1) {
        local_938 = std::
                    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ::operator[](local_970,local_9f0);
        local_940 = local_a60;
        in_stack_fffffffffffff4e0 = local_938->items + (long)local_a60;
        local_7e0 = &local_a78;
        local_7e8 = local_a38;
        local_624 = (in_stack_fffffffffffff4e0->field_0).m128[0];
        local_620 = &local_808;
        local_4b8 = CONCAT44(local_624,local_624);
        uStack_4b0 = CONCAT44(local_624,local_624);
        local_604 = (in_stack_fffffffffffff4e0->field_0).m128[1];
        local_600 = &local_828;
        local_518 = CONCAT44(local_604,local_604);
        uStack_510 = CONCAT44(local_604,local_604);
        local_728 = local_a28;
        local_5e4 = (in_stack_fffffffffffff4e0->field_0).m128[2];
        local_5e0 = &local_848;
        local_578 = CONCAT44(local_5e4,local_5e4);
        uStack_570 = CONCAT44(local_5e4,local_5e4);
        local_698 = local_a18;
        local_6a0 = local_a08;
        local_688 = &local_838;
        local_690 = &local_848;
        local_5b0 = &local_6b8;
        local_588 = (float)local_a18._0_8_;
        fStack_584 = SUB84(local_a18._0_8_,4);
        fStack_580 = (float)local_a18._8_8_;
        fStack_57c = SUB84(local_a18._8_8_,4);
        local_5a8 = local_5e4 * local_588;
        fStack_5a4 = local_5e4 * fStack_584;
        fStack_5a0 = local_5e4 * fStack_580;
        fStack_59c = local_5e4 * fStack_57c;
        local_590 = &local_6b8;
        local_638 = CONCAT44(fStack_5a4,local_5a8);
        uStack_630 = CONCAT44(fStack_59c,fStack_5a0);
        local_670 = &local_838;
        local_678 = &local_6b8;
        local_648 = (float)local_a08._0_8_;
        fStack_644 = SUB84(local_a08._0_8_,4);
        fStack_640 = (float)local_a08._8_8_;
        fStack_63c = SUB84(local_a08._8_8_,4);
        local_668 = local_5a8 + local_648;
        fStack_664 = fStack_5a4 + fStack_644;
        fStack_660 = fStack_5a0 + fStack_640;
        fStack_65c = fStack_59c + fStack_63c;
        local_650 = &local_838;
        local_718 = &local_818;
        local_720 = &local_828;
        local_730 = &local_838;
        local_550 = &local_748;
        local_528 = (float)local_a28._0_8_;
        fStack_524 = SUB84(local_a28._0_8_,4);
        fStack_520 = (float)local_a28._8_8_;
        fStack_51c = SUB84(local_a28._8_8_,4);
        local_548 = local_604 * local_528;
        fStack_544 = local_604 * fStack_524;
        fStack_540 = local_604 * fStack_520;
        fStack_53c = local_604 * fStack_51c;
        local_530 = &local_748;
        local_6c8 = CONCAT44(fStack_544,local_548);
        uStack_6c0 = CONCAT44(fStack_53c,fStack_540);
        local_700 = &local_818;
        local_708 = &local_748;
        local_6d8._0_4_ = (float)local_838;
        local_6d8._4_4_ = (float)((ulong)local_838 >> 0x20);
        uStack_6d0._0_4_ = (float)uStack_830;
        uStack_6d0._4_4_ = (float)((ulong)uStack_830 >> 0x20);
        local_6f8 = local_548 + (float)local_6d8;
        fStack_6f4 = fStack_544 + local_6d8._4_4_;
        fStack_6f0 = fStack_540 + (float)uStack_6d0;
        fStack_6ec = fStack_53c + uStack_6d0._4_4_;
        local_6e0 = &local_818;
        local_7a8 = &local_a78;
        local_7b0 = &local_808;
        local_7c0 = &local_818;
        local_4f0 = &local_7d8;
        local_4c8 = (float)local_a38._0_8_;
        fStack_4c4 = SUB84(local_a38._0_8_,4);
        fStack_4c0 = (float)local_a38._8_8_;
        fStack_4bc = SUB84(local_a38._8_8_,4);
        local_4e8 = local_624 * local_4c8;
        fStack_4e4 = local_624 * fStack_4c4;
        fStack_4e0 = local_624 * fStack_4c0;
        fStack_4dc = local_624 * fStack_4bc;
        local_4d0 = &local_7d8;
        local_758 = CONCAT44(fStack_4e4,local_4e8);
        uStack_750 = CONCAT44(fStack_4dc,fStack_4e0);
        local_790 = &local_a78;
        local_798 = &local_7d8;
        local_768._0_4_ = (float)local_818;
        local_768._4_4_ = (float)((ulong)local_818 >> 0x20);
        uStack_760._0_4_ = (float)uStack_810;
        uStack_760._4_4_ = (float)((ulong)uStack_810 >> 0x20);
        local_788 = local_4e8 + (float)local_768;
        fStack_784 = fStack_4e4 + local_768._4_4_;
        fStack_780 = fStack_4e0 + (float)uStack_760;
        fStack_77c = fStack_4dc + uStack_760._4_4_;
        local_770 = &local_a78;
        local_a78.upper = fStack_784;
        local_a78.lower = local_788;
        BStack_a70.upper = fStack_77c;
        BStack_a70.lower = fStack_780;
        local_8f8 = &local_a58;
        local_900 = local_a60;
        local_8c8 = &local_a40->time_range + (long)local_a60 * 2;
        local_8d0 = &local_a78;
        *local_8c8 = local_a78;
        local_8c8[1] = BStack_a70;
        local_7f0 = in_stack_fffffffffffff4e0;
        local_7b8 = local_7e8;
        local_7a0 = local_7c0;
        local_768 = local_818;
        uStack_760 = uStack_810;
        local_710 = local_730;
        local_6d8 = local_838;
        uStack_6d0 = uStack_830;
        local_680 = local_6a0;
        local_618 = local_624;
        fStack_614 = local_624;
        fStack_610 = local_624;
        fStack_60c = local_624;
        local_608 = local_624;
        local_5f8 = local_604;
        fStack_5f4 = local_604;
        fStack_5f0 = local_604;
        fStack_5ec = local_604;
        local_5e8 = local_604;
        local_5d8 = local_5e4;
        fStack_5d4 = local_5e4;
        fStack_5d0 = local_5e4;
        fStack_5cc = local_5e4;
        local_5c8 = local_5e4;
        puStack_5c0 = local_698;
        local_5b8 = local_690;
        local_560 = local_728;
        local_558 = local_720;
        local_500 = local_7e8;
        local_4f8 = local_7b0;
        local_848 = local_578;
        uStack_840 = uStack_570;
        local_838 = CONCAT44(fStack_664,local_668);
        uStack_830 = CONCAT44(fStack_65c,fStack_660);
        local_828 = local_518;
        uStack_820 = uStack_510;
        local_818 = CONCAT44(fStack_6f4,local_6f8);
        uStack_810 = CONCAT44(fStack_6ec,fStack_6f0);
        local_808 = local_4b8;
        uStack_800 = uStack_4b0;
        local_7d8 = local_758;
        uStack_7d0 = uStack_750;
        local_748 = local_6c8;
        uStack_740 = uStack_6c0;
        local_6b8 = local_638;
        uStack_6b0 = uStack_630;
        local_948 = std::
                    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ::operator[](local_970,local_9f0);
        local_950 = local_a60;
        local_910 = local_a60;
        local_908 = &local_a58;
        *(float *)(&(local_a40->spaces).field_0x4 + (long)local_a60 * 0x10) =
             local_948->items[(long)local_a60].field_0.m128[3];
      }
      std::
      vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
      ::push_back(in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8);
      pvVar10 = &local_a58;
      for (local_f0 = (pointer)0x0;
          local_f0 <
          local_a58.
          super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; local_f0 = (pointer)&local_f0->field_0x1) {
      }
      local_90 = local_a58.
                 super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_88 = local_a40;
      local_8a0 = pvVar10;
      local_e8 = pvVar10;
      local_80 = pvVar10;
      alignedFree(in_stack_fffffffffffff4a8);
      in_stack_fffffffffffff4b0 = pvVar10;
      pvVar10[1].
      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar10->
      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pvVar10->
      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    }
  }
  return in_RDI;
}

Assistant:

std::vector<avector<Vertex>> transformMSMBlurBuffer(const std::vector<avector<Vertex>>& positions_in, const Transformations& spaces)
    {
      std::vector<avector<Vertex>> positions_out;
      const size_t num_time_steps = positions_in.size(); assert(num_time_steps);
      const size_t num_vertices = positions_in[0].size();

      /* if we have only one set of vertices, use transformation to generate more vertex sets */
      if (num_time_steps == 1)
      {
        for (size_t i=0; i<spaces.size(); i++) 
        {
          avector<Vertex> verts(num_vertices);
          for (size_t j=0; j<num_vertices; j++) {
            verts[j] = xfmPoint(spaces[i],positions_in[0][j]);
            verts[j].w = positions_in[0][j].w;
          }
          positions_out.push_back(std::move(verts));
        }
      } 
      /* otherwise transform all vertex sets with interpolated transformation */
      else
      {
        for (size_t t=0; t<num_time_steps; t++) 
        {
          float time = num_time_steps > 1 ? float(t)/float(num_time_steps-1) : 0.0f;
          const AffineSpace3ff space = spaces.interpolate(time);
          avector<Vertex> verts(num_vertices);
          for (size_t i=0; i<num_vertices; i++) {
            verts[i] = xfmPoint (space,positions_in[t][i]);
            verts[i].w = positions_in[t][i].w;
          }
          positions_out.push_back(std::move(verts));
        }
      }
      return positions_out;
    }